

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_ref_t art_node16_insert(art_t *art,art_node16_t *node,art_ref_t child,uint8_t key)

{
  uint8_t *puVar1;
  art_node48_t *node_00;
  art_ref_t aVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)(node->field_0).field_0.count;
  if (uVar5 < 0x10) {
    for (uVar3 = 0;
        (uVar4 = uVar5, uVar5 != uVar3 &&
        (uVar4 = uVar3, *(byte *)((long)&node->field_0 + uVar3 + 7) <= key)); uVar3 = uVar3 + 1) {
    }
    memmove((void *)((long)&node->field_0 + uVar4 + 8),(void *)((long)&node->field_0 + uVar4 + 7),
            uVar5 - uVar4);
    memmove((void *)((long)&node->field_0 + uVar4 * 8 + 0x20),
            (void *)((long)&node->field_0 + uVar4 * 8 + 0x18),(uVar5 - uVar4) * 8);
    *(art_ref_t *)((long)&node->field_0 + uVar4 * 8 + 0x18) = child;
    *(uint8_t *)((long)&node->field_0 + uVar4 + 7) = key;
    puVar1 = &(node->field_0).field_0.count;
    *puVar1 = *puVar1 + '\x01';
    aVar2 = art_get_ref(art,node,'\x03');
    return aVar2;
  }
  node_00 = art_node48_create(art,(art_key_chunk_t *)((long)&node->field_0 + 1),
                              (node->field_0).field_0.base.prefix_size);
  for (lVar6 = 7; lVar6 != 0x17; lVar6 = lVar6 + 1) {
    art_node48_insert(art,node_00,*(art_ref_t *)((long)node + lVar6 * 8 + -0x20),
                      *(uint8_t *)((long)&node->field_0 + lVar6));
  }
  art_node_free(art,node,'\x03');
  aVar2 = art_node48_insert(art,node_00,child,key);
  return aVar2;
}

Assistant:

static art_ref_t art_node16_insert(art_t *art, art_node16_t *node,
                                   art_ref_t child, uint8_t key) {
    if (node->count < 16) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_ref_t));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    }
    art_node48_t *new_node =
        art_node48_create(art, node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 16; ++i) {
        art_node48_insert(art, new_node, node->children[i], node->keys[i]);
    }
    art_node_free(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    return art_node48_insert(art, new_node, child, key);
}